

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_build_name_lists_multiple(list_t *anms)

{
  undefined8 *puVar1;
  long lVar2;
  char *__s2;
  int iVar3;
  list_node_t *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  list_node_t *plVar7;
  char *__s1;
  anm_entry_t *tmp;
  long local_38;
  
  plVar4 = anms->head;
  do {
    if (plVar4 == (list_node_t *)0x0) {
      return;
    }
    for (puVar5 = *(undefined8 **)((long)plVar4->data + 0x10); puVar5 != (undefined8 *)0x0;
        puVar5 = (undefined8 *)*puVar5) {
      plVar7 = anms->head;
      if (plVar7 != (list_node_t *)0x0) {
        __s1 = (char *)puVar5[2];
        plVar6 = &local_38;
        do {
          for (puVar1 = *(undefined8 **)((long)plVar7->data + 0x20); puVar1 != (undefined8 *)0x0;
              puVar1 = (undefined8 *)*puVar1) {
            lVar2 = puVar1[2];
            __s2 = *(char **)(lVar2 + 0x10);
            if ((__s2 == __s1) || (iVar3 = strcmp(__s1,__s2), iVar3 == 0)) {
              if (*(long *)(lVar2 + 0x28) != 0) goto LAB_0010eb1f;
              *plVar6 = lVar2;
              plVar6 = (long *)(lVar2 + 0x28);
              __s1 = __s2;
            }
          }
          plVar7 = plVar7->next;
        } while (plVar7 != (list_node_t *)0x0);
      }
LAB_0010eb1f:
    }
    plVar4 = plVar4->next;
  } while( true );
}

Assistant:

static void
anm_build_name_lists_multiple(
    list_t *anms)
{
    const anm_archive_t *anm, *anm2;
    const char *name;
    anm_entry_t *entry, *tmp, **nextloc;
    list_for_each(anms, anm)
        list_for_each(&anm->names, name) {
            nextloc = &tmp;
            list_for_each(anms, anm2)
                list_for_each(&anm2->entries, entry)
                    if (entry->name == name || !strcmp(name, entry->name)) {
                        name = entry->name;
                        if (entry->next_by_name)
                            goto next_name; /* we already did this name */
                        *nextloc = entry;
                        nextloc = &entry->next_by_name;
                    }
            next_name:;
        }
}